

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O1

void __thiscall iu_AssertionTest_x_iutest_x_GT_Test::Body(iu_AssertionTest_x_iutest_x_GT_Test *this)

{
  AssertionResult iutest_ar;
  int x1;
  int x0;
  double d1;
  double d0;
  
  return;
}

Assistant:

IUTEST(AssertionTest, GT)
{
    int x0=0, x1=1;
    float f0=0.0f, f1=1.0f;
    double d0=0.0, d1=1.0;
    IUTEST_EXPECT_GT(f1, f0);
    IUTEST_ASSERT_GT(x1, x0);
    IUTEST_INFORM_GT(0x1, 0.0f);
    IUTEST_EXPECT_GT(d1, d0);
}